

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void runExample(ostream *out)

{
  int iVar1;
  undefined2 uStack_a2;
  allocator local_99;
  string local_98 [32];
  AdsDevice local_78 [8];
  AdsDevice route;
  ostream *out_local;
  
  if (runExample(std::ostream&)::remoteNetId == '\0') {
    iVar1 = __cxa_guard_acquire(&runExample(std::ostream&)::remoteNetId);
    if (iVar1 != 0) {
      AmsNetId::AmsNetId((AmsNetId *)&runExample(std::ostream&)::remoteNetId,0xc0,0xa8,'\0',0xe7,
                         '\x01','\x01');
      __cxa_guard_release(&runExample(std::ostream&)::remoteNetId);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"ads-server",&local_99);
  AdsDevice::AdsDevice
            (local_78,local_98,
             CONCAT26(uStack_a2,CONCAT24(_DAT_001091b5,runExample(std::ostream&)::remoteNetId)),
             0x353);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  notificationExample(out,local_78);
  notificationByNameExample(out,local_78);
  readExample(out,local_78);
  readByNameExample(out,local_78);
  readWriteExample(out,local_78);
  readWriteArrayExample(out,local_78);
  readStateExample(out,local_78);
  AdsDevice::~AdsDevice(local_78);
  return;
}

Assistant:

static void runExample(std::ostream& out)
{
    static const AmsNetId remoteNetId { 192, 168, 0, 231, 1, 1 };
    static const char remoteIpV4[] = "ads-server";

    // uncomment and adjust if automatic AmsNetId deduction is not working as expected
    //bhf::ads::SetLocalAddress({192, 168, 0, 1, 1, 1});

    AdsDevice route {remoteIpV4, remoteNetId, AMSPORT_R0_PLC_TC3};
    notificationExample(out, route);
    notificationByNameExample(out, route);
    readExample(out, route);
    readByNameExample(out, route);
    readWriteExample(out, route);
    readWriteArrayExample(out, route);
    readStateExample(out, route);
}